

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMFImporter_Postprocess.cpp
# Opt level: O2

void __thiscall
Assimp::AMFImporter::Postprocess_BuildConstellation
          (AMFImporter *this,CAMFImporter_NodeElement_Constellation *pConstellation,
          list<aiNode_*,_std::allocator<aiNode_*>_> *pNodeList)

{
  float fVar1;
  ulong __n;
  bool bVar2;
  aiNode *this_00;
  aiNode *paVar3;
  aiNode **ppaVar4;
  long lVar5;
  DeadlyImportError *pDVar6;
  iterator __begin1;
  _List_node_base *p_Var7;
  list<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_> *plVar8;
  _List_node_base *p_Var9;
  allocator<char> local_d9;
  aiNode *t_node;
  aiMatrix4x4 tmat;
  list<aiNode_*,_std::allocator<aiNode_*>_> ch_node;
  aiNode *found_node;
  aiNode *con_node;
  string local_50;
  
  ch_node.super__List_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)&ch_node;
  ch_node.super__List_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl._M_node._M_size = 0;
  ch_node.super__List_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl._M_node.
  super__List_node_base._M_prev =
       ch_node.super__List_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl._M_node.
       super__List_node_base._M_next;
  this_00 = (aiNode *)operator_new(0x478);
  aiNode::aiNode(this_00);
  __n = (pConstellation->super_CAMFImporter_NodeElement).ID._M_string_length;
  con_node = this_00;
  if (__n < 0x400) {
    (this_00->mName).length = (ai_uint32)__n;
    memcpy((this_00->mName).data,
           (pConstellation->super_CAMFImporter_NodeElement).ID._M_dataplus._M_p,__n);
    (this_00->mName).data[__n] = '\0';
  }
  plVar8 = &(pConstellation->super_CAMFImporter_NodeElement).Child;
  p_Var9 = (_List_node_base *)plVar8;
  do {
    while( true ) {
      p_Var7 = ch_node.super__List_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl._M_node.
               super__List_node_base._M_next;
      p_Var9 = (((_List_base<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_>
                  *)&p_Var9->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
      if (p_Var9 == (_List_node_base *)plVar8) {
        if (ch_node.super__List_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl._M_node.
            super__List_node_base._M_next != (_List_node_base *)&ch_node) {
          this_00->mNumChildren =
               (uint)ch_node.super__List_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl._M_node.
                     _M_size;
          ppaVar4 = (aiNode **)
                    operator_new__((ch_node.super__List_base<aiNode_*,_std::allocator<aiNode_*>_>.
                                    _M_impl._M_node._M_size & 0xffffffff) << 3);
          this_00->mChildren = ppaVar4;
          lVar5 = 0;
          for (; p_Var7 != (_List_node_base *)&ch_node;
              p_Var7 = (((_List_base<aiNode_*,_std::allocator<aiNode_*>_> *)&p_Var7->_M_next)->
                       _M_impl)._M_node.super__List_node_base._M_next) {
            *(size_t *)((long)this_00->mChildren + lVar5) = *(size_t *)(p_Var7 + 1);
            lVar5 = lVar5 + 8;
          }
          std::__cxx11::list<aiNode_*,_std::allocator<aiNode_*>_>::push_back(pNodeList,&con_node);
          std::__cxx11::_List_base<aiNode_*,_std::allocator<aiNode_*>_>::_M_clear
                    (&ch_node.super__List_base<aiNode_*,_std::allocator<aiNode_*>_>);
          return;
        }
        pDVar6 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&tmat,"<constellation> must have at least one <instance>.",
                   (allocator<char> *)&local_50);
        DeadlyImportError::DeadlyImportError(pDVar6,(string *)&tmat);
        __cxa_throw(pDVar6,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
      }
      lVar5 = (long)p_Var9[1]._M_next;
      tmat.a1 = 1.0;
      tmat.a2 = 0.0;
      tmat.a3 = 0.0;
      tmat.a4 = 0.0;
      tmat.b1 = 0.0;
      tmat.b2 = 1.0;
      tmat.b3 = 0.0;
      tmat.b4 = 0.0;
      tmat.c1 = 0.0;
      tmat.c2 = 0.0;
      tmat.c3 = 1.0;
      tmat.c4 = 0.0;
      tmat.d1 = 0.0;
      tmat.d2 = 0.0;
      tmat.d3 = 0.0;
      tmat.d4 = 1.0;
      if (*(int *)(lVar5 + 8) != 4) break;
      bVar2 = Find_ConvertedNode(this,(string *)(lVar5 + 0x50),pNodeList,&found_node);
      if (!bVar2) {
        Throw_ID_NotFound(this,(string *)(lVar5 + 0x50));
      }
      paVar3 = (aiNode *)operator_new(0x478);
      aiNode::aiNode(paVar3);
      tmat.a1 = 1.0;
      tmat.a2 = 0.0;
      tmat.a3 = 0.0;
      tmat.b1 = 0.0;
      tmat.b2 = 1.0;
      tmat.b3 = 0.0;
      tmat.c1 = 0.0;
      tmat.c2 = 0.0;
      tmat.c3 = 1.0;
      tmat.d3 = 0.0;
      paVar3->mParent = this_00;
      tmat.d1 = 0.0;
      tmat.d2 = 0.0;
      tmat.d4 = 1.0;
      tmat.a4 = *(float *)(lVar5 + 0x70);
      tmat.b4 = *(float *)(lVar5 + 0x74);
      tmat.c4 = *(float *)(lVar5 + 0x78);
      t_node = paVar3;
      aiMatrix4x4t<float>::operator*=(&paVar3->mTransformation,&tmat);
      fVar1 = *(float *)(lVar5 + 0x7c);
      tmat.a1 = 1.0;
      tmat.a2 = 0.0;
      tmat.a3 = 0.0;
      tmat.a4 = 0.0;
      tmat.b1 = 0.0;
      tmat.b4 = 0.0;
      tmat.c1 = 0.0;
      tmat.c4 = 0.0;
      tmat.d1 = 0.0;
      tmat.d2 = 0.0;
      tmat.d3 = 0.0;
      tmat.d4 = 1.0;
      tmat.b2 = cosf(fVar1);
      tmat.c3 = tmat.b2;
      tmat.c2 = sinf(fVar1);
      tmat.b3 = -tmat.c2;
      aiMatrix4x4t<float>::operator*=(&t_node->mTransformation,&tmat);
      fVar1 = *(float *)(lVar5 + 0x80);
      tmat.a2 = 0.0;
      tmat.a3 = 0.0;
      tmat.a4 = 0.0;
      tmat.b1 = 0.0;
      tmat.b2 = 1.0;
      tmat.b3 = 0.0;
      tmat.b4 = 0.0;
      tmat.c1 = 0.0;
      tmat.c2 = 0.0;
      tmat.c4 = 0.0;
      tmat.d1 = 0.0;
      tmat.d2 = 0.0;
      tmat.d3 = 0.0;
      tmat.d4 = 1.0;
      tmat.a1 = cosf(fVar1);
      tmat.c3 = tmat.a1;
      tmat.a3 = sinf(fVar1);
      tmat.c1 = -tmat.a3;
      aiMatrix4x4t<float>::operator*=(&t_node->mTransformation,&tmat);
      fVar1 = *(float *)(lVar5 + 0x84);
      tmat.a3 = 0.0;
      tmat.a4 = 0.0;
      tmat.b3 = 0.0;
      tmat.b4 = 0.0;
      tmat.c1 = 0.0;
      tmat.c2 = 0.0;
      tmat.c3 = 1.0;
      tmat.c4 = 0.0;
      tmat.d1 = 0.0;
      tmat.d2 = 0.0;
      tmat.d3 = 0.0;
      tmat.d4 = 1.0;
      tmat.a1 = cosf(fVar1);
      tmat.b2 = tmat.a1;
      tmat.b1 = sinf(fVar1);
      tmat.a2 = -tmat.b1;
      aiMatrix4x4t<float>::operator*=(&t_node->mTransformation,&tmat);
      paVar3 = t_node;
      t_node->mNumChildren = 1;
      ppaVar4 = (aiNode **)operator_new__(8);
      paVar3->mChildren = ppaVar4;
      SceneCombiner::Copy(ppaVar4,found_node);
      (*t_node->mChildren)->mParent = t_node;
      std::__cxx11::list<aiNode_*,_std::allocator<aiNode_*>_>::push_back(&ch_node,&t_node);
    }
  } while (*(int *)(lVar5 + 8) == 6);
  pDVar6 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"Only <instance> nodes can be in <constellation>.",&local_d9);
  DeadlyImportError::DeadlyImportError(pDVar6,&local_50);
  __cxa_throw(pDVar6,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void AMFImporter::Postprocess_BuildConstellation(CAMFImporter_NodeElement_Constellation& pConstellation, std::list<aiNode*>& pNodeList) const
{
aiNode* con_node;
std::list<aiNode*> ch_node;

	// We will build next hierarchy:
	// aiNode as parent (<constellation>) for set of nodes as a children
	//  |- aiNode for transformation (<instance> -> <delta...>, <r...>) - aiNode for pointing to object ("objectid")
	//  ...
	//  \_ aiNode for transformation (<instance> -> <delta...>, <r...>) - aiNode for pointing to object ("objectid")
	con_node = new aiNode;
	con_node->mName = pConstellation.ID;
	// Walk through children and search for instances of another objects, constellations.
	for(const CAMFImporter_NodeElement* ne: pConstellation.Child)
	{
		aiMatrix4x4 tmat;
		aiNode* t_node;
		aiNode* found_node;

		if(ne->Type == CAMFImporter_NodeElement::ENET_Metadata) continue;
		if(ne->Type != CAMFImporter_NodeElement::ENET_Instance) throw DeadlyImportError("Only <instance> nodes can be in <constellation>.");

		// create alias for conveniance
		CAMFImporter_NodeElement_Instance& als = *((CAMFImporter_NodeElement_Instance*)ne);
		// find referenced object
		if(!Find_ConvertedNode(als.ObjectID, pNodeList, &found_node)) Throw_ID_NotFound(als.ObjectID);

		// create node for applying transformation
		t_node = new aiNode;
		t_node->mParent = con_node;
		// apply transformation
		aiMatrix4x4::Translation(als.Delta, tmat), t_node->mTransformation *= tmat;
		aiMatrix4x4::RotationX(als.Rotation.x, tmat), t_node->mTransformation *= tmat;
		aiMatrix4x4::RotationY(als.Rotation.y, tmat), t_node->mTransformation *= tmat;
		aiMatrix4x4::RotationZ(als.Rotation.z, tmat), t_node->mTransformation *= tmat;
		// create array for one child node
		t_node->mNumChildren = 1;
		t_node->mChildren = new aiNode*[t_node->mNumChildren];
		SceneCombiner::Copy(&t_node->mChildren[0], found_node);
		t_node->mChildren[0]->mParent = t_node;
		ch_node.push_back(t_node);
	}// for(const CAMFImporter_NodeElement* ne: pConstellation.Child)

	// copy found aiNode's as children
	if(ch_node.empty()) throw DeadlyImportError("<constellation> must have at least one <instance>.");

	size_t ch_idx = 0;

	con_node->mNumChildren = static_cast<unsigned int>(ch_node.size());
	con_node->mChildren = new aiNode*[con_node->mNumChildren];
	for(aiNode* node: ch_node) con_node->mChildren[ch_idx++] = node;

	// and place "root" of <constellation> node to node list
	pNodeList.push_back(con_node);
}